

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

int __thiscall
soplex::SPxFastRT<double>::maxSelect
          (SPxFastRT<double> *this,double *val,double *stab,double *bestDelta,double max)

{
  int iVar1;
  undefined8 *in_RCX;
  long in_RDI;
  UpdateVector<double> *unaff_retaddr;
  double in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  double *in_stack_00000020;
  double *in_stack_00000028;
  SPxFastRT<double> *in_stack_00000030;
  VectorBase<double> *in_stack_00000040;
  VectorBase<double> *in_stack_00000048;
  int in_stack_00000050;
  double best;
  
  infinity();
  *in_RCX = 0;
  SPxSolverBase<double>::fVec(*(SPxSolverBase<double> **)(in_RDI + 8));
  SPxSolverBase<double>::lbBound(*(SPxSolverBase<double> **)(in_RDI + 8));
  SPxSolverBase<double>::ubBound(*(SPxSolverBase<double> **)(in_RDI + 8));
  iVar1 = maxSelect(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                    in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_00000040,
                    in_stack_00000048,in_stack_00000050,best._0_4_);
  return iVar1;
}

Assistant:

int SPxFastRT<R>::maxSelect(
   R& val,
   R& stab,
   R& bestDelta,
   R max)
{
   R best = R(-infinity);
   bestDelta = 0.0;
   assert(this->m_type == SPxSolverBase<R>::ENTER);
   return maxSelect(val, stab, best, bestDelta, max,
                    this->thesolver->fVec(), this->thesolver->lbBound(), this->thesolver->ubBound(),  0, 1);
}